

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a4_aux.c
# Opt level: O1

void matrix_mul_f(MATRIX_f *m1,MATRIX_f *m2,MATRIX_f *out)

{
  float (*pafVar1) [3];
  float (*pafVar2) [3];
  float *pfVar3;
  MATRIX_f *pMVar4;
  MATRIX_f *pMVar5;
  float (*pafVar6) [3];
  long lVar7;
  MATRIX_f *pMVar8;
  long lVar9;
  MATRIX_f local_48;
  
  pMVar4 = m2;
  if (m1 == out) {
    pfVar3 = local_48.t;
    pafVar2 = local_48.v + 2;
    pMVar5 = &local_48;
    pafVar6 = local_48.v + 1;
    m2 = m1;
  }
  else {
    pafVar2 = m1->v + 2;
    pafVar6 = m1->v + 1;
    pfVar3 = m1->t;
    pMVar5 = m1;
    if (m2 != out) goto LAB_0010622a;
    pMVar4 = &local_48;
  }
  local_48._32_8_ = *(undefined8 *)(m2->v[2] + 2);
  local_48.t._4_8_ = *(undefined8 *)(m2->t + 1);
  local_48.v[1]._4_8_ = *(undefined8 *)(m2->v[1] + 1);
  local_48.v[2]._0_8_ = *(undefined8 *)m2->v[2];
  local_48.v[0]._0_8_ = *(undefined8 *)m2->v[0];
  local_48.v._8_8_ = *(undefined8 *)(m2->v[0] + 2);
LAB_0010622a:
  lVar7 = 0;
  pMVar8 = out;
  do {
    pafVar1 = pMVar4->v + lVar7;
    lVar9 = 0;
    do {
      pMVar8->v[0][lVar9] =
           (*pafVar2)[lVar9] * (*pafVar1)[2] +
           pMVar5->v[0][lVar9] * (*pafVar1)[0] + (*pafVar6)[lVar9] * (*pafVar1)[1];
      lVar9 = lVar9 + 1;
    } while (lVar9 != 3);
    out->t[lVar7] =
         pfVar3[2] * pMVar4->v[lVar7][2] +
         *pfVar3 * pMVar4->v[lVar7][0] + pfVar3[1] * pMVar4->v[lVar7][1] + pMVar4->t[lVar7];
    lVar7 = lVar7 + 1;
    pMVar8 = (MATRIX_f *)(pMVar8->v + 1);
  } while (lVar7 != 3);
  return;
}

Assistant:

void matrix_mul_f(const MATRIX_f *m1, const MATRIX_f *m2, MATRIX_f *out)
{
   MATRIX_f temp;
   int i, j;

   if (m1 == out) {
      temp = *m1;
      m1 = &temp;
   }
   else if (m2 == out) {
      temp = *m2;
      m2 = &temp;
   }

   for (i=0; i<3; i++) {
      for (j=0; j<3; j++) {
	 out->v[i][j] = (m1->v[0][j] * m2->v[i][0]) +
			(m1->v[1][j] * m2->v[i][1]) +
			(m1->v[2][j] * m2->v[i][2]);
      }

      out->t[i] = (m1->t[0] * m2->v[i][0]) +
		  (m1->t[1] * m2->v[i][1]) +
		  (m1->t[2] * m2->v[i][2]) +
		  m2->t[i];
   }
}